

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture2_GetNumComponentsTestRGBA8_BasisLZ_Test::
~ktxTexture2_GetNumComponentsTestRGBA8_BasisLZ_Test
          (ktxTexture2_GetNumComponentsTestRGBA8_BasisLZ_Test *this)

{
  ktxTextureTestBase<unsigned_char,_4U,_32856U>::~ktxTextureTestBase
            ((ktxTextureTestBase<unsigned_char,_4U,_32856U> *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F(ktxTexture2_GetNumComponentsTestRGBA8, BasisLZ) {
    ktxTexture2* texture;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        ktx_uint32_t components = ktxTexture2_GetNumComponents(texture);
        EXPECT_EQ(components, 4U);
        ktxTexture2_CompressBasis(texture, 0);
        EXPECT_EQ(components, ktxTexture2_GetNumComponents(texture));
        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));
    }
}